

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t icu_63::TimeZoneFormat::parseAbuttingAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,OffsetFields minFields,
                  OffsetFields maxFields,UBool fixedHourWidth)

{
  int iVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char16_t *pcVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int local_48 [6];
  int32_t digits [6];
  
  iVar3 = pos->index;
  iVar6 = (minFields * 2 - (uint)(fixedHourWidth == '\0')) + 2;
  uVar4 = maxFields * 2 + 2;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  else {
    sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar9 = (text->fUnion).fFields.fLength;
    }
    else {
      uVar9 = (int)sVar2 >> 5;
    }
    if (((int)sVar2 & 2U) == 0) {
      pcVar7 = (text->fUnion).fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&text->fUnion + 2);
    }
    uVar8 = 0;
    do {
      uVar5 = (uint)uVar8;
      if (((long)(int)uVar9 <= (long)((long)iVar3 + uVar8)) || (uVar9 <= iVar3 + uVar5)) break;
      iVar13 = (ushort)pcVar7[(long)iVar3 + uVar8] - 0x30;
      if (9 < (ushort)iVar13) {
        iVar13 = -1;
      }
      if (iVar13 < 0) break;
      local_48[uVar8] = iVar13;
      uVar8 = uVar8 + 1;
      uVar5 = uVar4;
    } while (uVar4 != uVar8);
  }
  iVar13 = uVar5 - ((byte)uVar5 & fixedHourWidth != '\0');
  if (iVar6 <= iVar13) {
    iVar1 = local_48[1] + local_48[0] * 10;
    iVar10 = local_48[3] + local_48[2] * 10;
    local_48[2] = local_48[2] + local_48[1] * 10;
    do {
      iVar14 = 0;
      iVar11 = iVar1;
      iVar12 = iVar10;
      switch(iVar13) {
      case 1:
        iVar11 = local_48[0];
        goto LAB_002001de;
      case 2:
        goto LAB_002001de;
      case 3:
        iVar11 = local_48[0];
        iVar12 = local_48[2];
        break;
      case 4:
        break;
      case 5:
        iVar11 = local_48[0];
        iVar14 = local_48[4] + local_48[3] * 10;
        iVar12 = local_48[2];
        break;
      case 6:
        iVar14 = local_48[4] * 10 + local_48[5];
        break;
      default:
        iVar11 = 0;
LAB_002001de:
        iVar12 = 0;
      }
      if (((iVar11 < 0x18) && (iVar12 < 0x3c)) && (iVar14 < 0x3c)) {
        pos->index = iVar3 + iVar13;
        return ((iVar11 * 0x3c + iVar12) * 0x3c + iVar14) * 1000;
      }
      iVar13 = iVar13 + (fixedHourWidth == '\0' | 0xfffffffe);
    } while (iVar6 <= iVar13);
  }
  pos->errorIndex = iVar3;
  return 0;
}

Assistant:

int32_t
TimeZoneFormat::parseAbuttingAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, OffsetFields minFields, OffsetFields maxFields, UBool fixedHourWidth) {
    int32_t start = pos.getIndex();

    int32_t minDigits = 2 * (minFields + 1) - (fixedHourWidth ? 0 : 1);
    int32_t maxDigits = 2 * (maxFields + 1);

    U_ASSERT(maxDigits <= MAX_OFFSET_DIGITS);

    int32_t digits[MAX_OFFSET_DIGITS] = {};
    int32_t numDigits = 0;
    int32_t idx = start;
    while (numDigits < maxDigits && idx < text.length()) {
        UChar uch = text.charAt(idx);
        int32_t digit = DIGIT_VAL(uch);
        if (digit < 0) {
            break;
        }
        digits[numDigits] = digit;
        numDigits++;
        idx++;
    }

    if (fixedHourWidth && (numDigits & 1)) {
        // Fixed digits, so the number of digits must be even number. Truncating.
        numDigits--;
    }

    if (numDigits < minDigits) {
        pos.setErrorIndex(start);
        return 0;
    }

    int32_t hour = 0, min = 0, sec = 0;
    UBool bParsed = FALSE;
    while (numDigits >= minDigits) {
        switch (numDigits) {
        case 1: //H
            hour = digits[0];
            break;
        case 2: //HH
            hour = digits[0] * 10 + digits[1];
            break;
        case 3: //Hmm
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            break;
        case 4: //HHmm
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            break;
        case 5: //Hmmss
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            sec = digits[3] * 10 + digits[4];
            break;
        case 6: //HHmmss
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            sec = digits[4] * 10 + digits[5];
            break;
        }

        if (hour <= MAX_OFFSET_HOUR && min <= MAX_OFFSET_MINUTE && sec <= MAX_OFFSET_SECOND) {
            // Successfully parsed
            bParsed = true;
            break;
        }

        // Truncating
        numDigits -= (fixedHourWidth ? 2 : 1);
        hour = min = sec = 0;
    }

    if (!bParsed) {
        pos.setErrorIndex(start);
        return 0;
    }
    pos.setIndex(start + numDigits);
    return ((((hour * 60) + min) * 60) + sec) * 1000;
}